

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O0

void __thiscall
soul::SourceCodeOperations::removeProcessor(SourceCodeOperations *this,ProcessorBase *p)

{
  CodeLocation local_40;
  CodeLocation local_30;
  ModuleDeclaration *local_20;
  ModuleDeclaration *d;
  ProcessorBase *p_local;
  SourceCodeOperations *this_local;
  
  d = (ModuleDeclaration *)p;
  p_local = (ProcessorBase *)this;
  local_20 = findDeclaration(this,&p->super_ModuleBase);
  checkAssertion(local_20 != (ModuleDeclaration *)0x0,"d != nullptr","removeProcessor",0x30);
  CodeLocation::CodeLocation(&local_30,&local_20->startIncludingPreamble);
  CodeLocation::CodeLocation(&local_40,&local_20->endOfClosingBrace);
  deleteText(this,&local_30,&local_40);
  CodeLocation::~CodeLocation(&local_40);
  CodeLocation::~CodeLocation(&local_30);
  reparse(this);
  return;
}

Assistant:

void SourceCodeOperations::removeProcessor (AST::ProcessorBase& p)
{
    auto d = findDeclaration (p);
    SOUL_ASSERT (d != nullptr);
    deleteText (d->startIncludingPreamble, d->endOfClosingBrace);
    reparse();
}